

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void andres::marray_detail::
     AssignmentOperatorHelper<false,_int,_int,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
     ::execute(View<int,_true,_std::allocator<unsigned_long>_> *from,
              View<int,_false,_std::allocator<unsigned_long>_> *to)

{
  CoordinateOrder CVar1;
  int iVar2;
  pointer __dest;
  pointer __src;
  undefined8 uVar3;
  bool bVar4;
  size_t sVar5;
  size_t sVar6;
  CoordinateOrder *pCVar7;
  reference piVar8;
  reference piVar9;
  reference piVar10;
  reference piVar11;
  bool local_e1;
  undefined1 local_e0 [8];
  ToIterator itTo;
  FromIterator itFrom;
  undefined1 local_68 [8];
  Marray<int,_std::allocator<unsigned_long>_> m;
  size_t j;
  View<int,_false,_std::allocator<unsigned_long>_> *to_local;
  View<int,_true,_std::allocator<unsigned_long>_> *from_local;
  
  local_e1 = false;
  if (from->data_ != (pointer)0x0) {
    sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(from);
    sVar6 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(to);
    local_e1 = sVar5 == sVar6;
  }
  Assert<bool>(local_e1);
  for (m._64_8_ = 0; uVar3 = m._64_8_,
      sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(from), (ulong)uVar3 < sVar5
      ; m._64_8_ = m._64_8_ + 1) {
    sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::shape(from,m._64_8_);
    sVar6 = View<int,_false,_std::allocator<unsigned_long>_>::shape(to,m._64_8_);
    Assert<bool>(sVar5 == sVar6);
  }
  bVar4 = View<int,true,std::allocator<unsigned_long>>::
          overlaps<int,false,std::allocator<unsigned_long>>
                    ((View<int,true,std::allocator<unsigned_long>> *)from,to);
  if (bVar4) {
    Marray<int,std::allocator<unsigned_long>>::Marray<int,true,std::allocator<unsigned_long>>
              ((Marray<int,std::allocator<unsigned_long>> *)local_68,from);
    execute((View<int,_false,_std::allocator<unsigned_long>_> *)local_68,to);
    Marray<int,_std::allocator<unsigned_long>_>::~Marray
              ((Marray<int,_std::allocator<unsigned_long>_> *)local_68);
  }
  else {
    pCVar7 = View<int,_true,_std::allocator<unsigned_long>_>::coordinateOrder(from);
    CVar1 = *pCVar7;
    pCVar7 = View<int,_false,_std::allocator<unsigned_long>_>::coordinateOrder(to);
    if (((CVar1 == *pCVar7) &&
        (bVar4 = View<int,_true,_std::allocator<unsigned_long>_>::isSimple(from), bVar4)) &&
       (bVar4 = View<int,_false,_std::allocator<unsigned_long>_>::isSimple(to), bVar4)) {
      __dest = to->data_;
      __src = from->data_;
      sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::size(from);
      memcpy(__dest,__src,sVar5 << 2);
    }
    else {
      sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(from);
      if (sVar5 == 1) {
        piVar8 = View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)to,0);
        piVar9 = View<int,true,std::allocator<unsigned_long>>::operator()
                           ((View<int,true,std::allocator<unsigned_long>> *)from,0);
        OperateHelperBinary<(unsigned_short)1,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
        ::operate(to,from,piVar8,piVar9);
      }
      else {
        sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(from);
        if (sVar5 == 2) {
          piVar8 = View<int,false,std::allocator<unsigned_long>>::operator()
                             ((View<int,false,std::allocator<unsigned_long>> *)to,0);
          piVar9 = View<int,true,std::allocator<unsigned_long>>::operator()
                             ((View<int,true,std::allocator<unsigned_long>> *)from,0);
          OperateHelperBinary<(unsigned_short)2,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
          ::operate(to,from,piVar8,piVar9);
        }
        else {
          sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(from);
          if (sVar5 == 3) {
            piVar8 = View<int,false,std::allocator<unsigned_long>>::operator()
                               ((View<int,false,std::allocator<unsigned_long>> *)to,0);
            piVar9 = View<int,true,std::allocator<unsigned_long>>::operator()
                               ((View<int,true,std::allocator<unsigned_long>> *)from,0);
            OperateHelperBinary<(unsigned_short)3,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
            ::operate(to,from,piVar8,piVar9);
          }
          else {
            sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(from);
            if (sVar5 == 4) {
              piVar8 = View<int,false,std::allocator<unsigned_long>>::operator()
                                 ((View<int,false,std::allocator<unsigned_long>> *)to,0);
              piVar9 = View<int,true,std::allocator<unsigned_long>>::operator()
                                 ((View<int,true,std::allocator<unsigned_long>> *)from,0);
              OperateHelperBinary<(unsigned_short)4,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
              ::operate(to,from,piVar8,piVar9);
            }
            else {
              sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(from);
              if (sVar5 == 5) {
                piVar8 = View<int,false,std::allocator<unsigned_long>>::operator()
                                   ((View<int,false,std::allocator<unsigned_long>> *)to,0);
                piVar9 = View<int,true,std::allocator<unsigned_long>>::operator()
                                   ((View<int,true,std::allocator<unsigned_long>> *)from,0);
                OperateHelperBinary<(unsigned_short)5,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                ::operate(to,from,piVar8,piVar9);
              }
              else {
                sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(from);
                if (sVar5 == 6) {
                  piVar8 = View<int,false,std::allocator<unsigned_long>>::operator()
                                     ((View<int,false,std::allocator<unsigned_long>> *)to,0);
                  piVar9 = View<int,true,std::allocator<unsigned_long>>::operator()
                                     ((View<int,true,std::allocator<unsigned_long>> *)from,0);
                  OperateHelperBinary<(unsigned_short)6,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                  ::operate(to,from,piVar8,piVar9);
                }
                else {
                  sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(from);
                  if (sVar5 == 7) {
                    piVar8 = View<int,false,std::allocator<unsigned_long>>::operator()
                                       ((View<int,false,std::allocator<unsigned_long>> *)to,0);
                    piVar9 = View<int,true,std::allocator<unsigned_long>>::operator()
                                       ((View<int,true,std::allocator<unsigned_long>> *)from,0);
                    OperateHelperBinary<(unsigned_short)7,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                    ::operate(to,from,piVar8,piVar9);
                  }
                  else {
                    sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(from);
                    if (sVar5 == 8) {
                      piVar8 = View<int,false,std::allocator<unsigned_long>>::operator()
                                         ((View<int,false,std::allocator<unsigned_long>> *)to,0);
                      piVar9 = View<int,true,std::allocator<unsigned_long>>::operator()
                                         ((View<int,true,std::allocator<unsigned_long>> *)from,0);
                      OperateHelperBinary<(unsigned_short)8,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                      ::operate(to,from,piVar8,piVar9);
                    }
                    else {
                      sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(from);
                      if (sVar5 == 9) {
                        piVar8 = View<int,false,std::allocator<unsigned_long>>::operator()
                                           ((View<int,false,std::allocator<unsigned_long>> *)to,0);
                        piVar9 = View<int,true,std::allocator<unsigned_long>>::operator()
                                           ((View<int,true,std::allocator<unsigned_long>> *)from,0);
                        OperateHelperBinary<(unsigned_short)9,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                        ::operate(to,from,piVar8,piVar9);
                      }
                      else {
                        sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(from);
                        if (sVar5 == 10) {
                          piVar8 = View<int,false,std::allocator<unsigned_long>>::operator()
                                             ((View<int,false,std::allocator<unsigned_long>> *)to,0)
                          ;
                          piVar9 = View<int,true,std::allocator<unsigned_long>>::operator()
                                             ((View<int,true,std::allocator<unsigned_long>> *)from,0
                                             );
                          OperateHelperBinary<(unsigned_short)10,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                          ::operate(to,from,piVar8,piVar9);
                        }
                        else {
                          View<int,_true,_std::allocator<unsigned_long>_>::begin
                                    ((const_iterator *)
                                     &itTo.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,from);
                          View<int,_false,_std::allocator<unsigned_long>_>::begin
                                    ((iterator *)local_e0,to);
                          while (bVar4 = Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                         hasMore((Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&itTo.coordinates_.
                                                                                                          
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                ), bVar4) {
                            piVar10 = Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                                                ((Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&itTo.coordinates_.
                                                                                                          
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                );
                            iVar2 = *piVar10;
                            piVar11 = Iterator<int,_false,_std::allocator<unsigned_long>_>::
                                      operator*((Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                 *)local_e0);
                            *piVar11 = iVar2;
                            Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                                      ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
                                       &itTo.coordinates_.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                            Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++
                                      ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
                                       local_e0);
                          }
                          Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
                                    ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
                                     local_e0);
                          Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
                                    ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
                                     &itTo.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void execute
    (
        const View<TFrom, true, AFrom>& from,
        View<TTo, false, ATo>& to
    )
    {
        typedef typename View<TFrom, true, AFrom>::const_iterator FromIterator;
        typedef typename View<TTo, false, ATo>::iterator ToIterator;
        if(!MARRAY_NO_ARG_TEST) {
            Assert(from.data_ != 0 && from.dimension() == to.dimension());
            for(std::size_t j=0; j<from.dimension(); ++j) {
                Assert(from.shape(j) == to.shape(j));
            }
        }
        if(from.overlaps(to)) {
            Marray<TFrom, AFrom> m = from; // temporary copy
            execute(m, to);
        }
        else if(from.coordinateOrder() == to.coordinateOrder() 
                && from.isSimple() && to.isSimple()
                && IsEqual<TFrom, TTo>::type) {
            memcpy(to.data_, from.data_, (from.size())*sizeof(TFrom));
        }
        else if(from.dimension() == 1)
            OperateHelperBinary<1, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else if(from.dimension() == 2)
            OperateHelperBinary<2, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else if(from.dimension() == 3)
            OperateHelperBinary<3, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else if(from.dimension() == 4)
            OperateHelperBinary<4, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else if(from.dimension() == 5)
            OperateHelperBinary<5, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else if(from.dimension() == 6)
            OperateHelperBinary<6, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else if(from.dimension() == 7)
            OperateHelperBinary<7, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else if(from.dimension() == 8)
            OperateHelperBinary<8, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else if(from.dimension() == 9)
            OperateHelperBinary<9, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else if(from.dimension() == 10)
            OperateHelperBinary<10, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else {
            FromIterator itFrom = from.begin();
            ToIterator itTo = to.begin();
            for(; itFrom.hasMore(); ++itFrom, ++itTo) {
                *itTo = static_cast<TTo>(*itFrom);
            }
        }
    }